

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O3

string * __thiscall
cmNewLineStyle::GetCharacters_abi_cxx11_(string *__return_storage_ptr__,cmNewLineStyle *this)

{
  Style SVar1;
  char *pcVar2;
  char *pcVar3;
  
  SVar1 = this->NewLineStyle;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (SVar1 == CRLF) {
    pcVar3 = "\r\n";
    pcVar2 = "";
  }
  else if (SVar1 == LF) {
    pcVar3 = "\n";
    pcVar2 = "";
  }
  else {
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNewLineStyle::GetCharacters() const
{
  switch (this->NewLineStyle) {
    case Invalid:
      return "";
    case LF:
      return "\n";
    case CRLF:
      return "\r\n";
  }
  return "";
}